

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collect.h
# Opt level: O3

void __thiscall
async_simple::coro::detail::
CollectAnyVariadicPairAwaiter<std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]cinatra/tests/test_cinatra.cpp:1149:37)>_>
::~CollectAnyVariadicPairAwaiter
          (CollectAnyVariadicPairAwaiter<std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
           *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  void *pvVar1;
  Handle HVar2;
  
  this_00 = (this->_result).
            super___shared_ptr<std::optional<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pvVar1 = (this->_input).
           super__Tuple_impl<0UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
           .
           super__Head_base<0UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_false>
           ._M_head_impl.first.super_LazyBase<async_simple::Try<void>,_false>._coro.__handle_;
  if (pvVar1 != (void *)0x0) {
    (**(code **)((long)pvVar1 + 8))();
    (this->_input).
    super__Tuple_impl<0UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
    .
    super__Head_base<0UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_false>
    ._M_head_impl.first.super_LazyBase<async_simple::Try<void>,_false>._coro.__handle_ = (void *)0x0
    ;
  }
  HVar2.__handle_ =
       *(void **)&(this->_input).
                  super__Tuple_impl<0UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
                  .
                  super__Tuple_impl<1UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
                  .
                  super__Head_base<1UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>,_false>
                  ._M_head_impl.first.super_LazyBase<async_simple::Try<void>,_false>;
  if ((Handle)HVar2.__handle_ != (Handle)0x0) {
    (**(code **)((long)HVar2.__handle_ + 8))();
    (this->_input).
    super__Tuple_impl<0UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1143:37)>,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
    .
    super__Tuple_impl<1UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>_>
    .
    super__Head_base<1UL,_std::pair<async_simple::coro::Lazy<async_simple::Try<void>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]cinatra_tests_test_cinatra_cpp:1149:37)>,_false>
    ._M_head_impl.first.super_LazyBase<async_simple::Try<void>,_false> =
         (LazyBase<async_simple::Try<void>,_false>)0x0;
  }
  return;
}

Assistant:

CollectAnyVariadicPairAwaiter(Ts&&... inputs)
        : _input(std::move(inputs)...), _result(nullptr) {}